

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

void bus0_sock_send(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  uint32_t uVar2;
  nni_msg *m;
  size_t count;
  size_t sVar3;
  size_t len;
  undefined8 *puStack_30;
  uint32_t sender;
  bus0_pipe *pipe;
  nni_msg *msg;
  bus0_sock *s;
  nni_aio *aio_local;
  void *arg_local;
  
  len._4_4_ = 0;
  m = nni_aio_get_msg(aio);
  count = nni_msg_len(m);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  if ((*(byte *)((long)arg + 0xc4) & 1) == 0) {
    nni_msg_header_clear(m);
  }
  else {
    sVar3 = nni_msg_header_len(m);
    if (3 < sVar3) {
      len._4_4_ = nni_msg_header_trim_u32(m);
    }
  }
  nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
  _Var1 = nni_aio_start(aio,(nni_aio_cancel_fn)0x0,(void *)0x0);
  if (_Var1) {
    for (puStack_30 = (undefined8 *)nni_list_first((nni_list *)arg); puStack_30 != (undefined8 *)0x0
        ; puStack_30 = (undefined8 *)nni_list_next((nni_list *)arg,puStack_30)) {
      if (((*(byte *)((long)arg + 0xc4) & 1) == 0) ||
         (uVar2 = nni_pipe_id((nni_pipe *)*puStack_30), uVar2 != len._4_4_)) {
        if ((*(byte *)(puStack_30 + 0xd) & 1) == 0) {
          *(undefined1 *)(puStack_30 + 0xd) = 1;
          nni_msg_clone(m);
          nni_aio_set_msg((nni_aio *)(puStack_30 + 0x47),m);
          nni_pipe_send((nni_pipe *)*puStack_30,(nni_aio *)(puStack_30 + 0x47));
        }
        else {
          _Var1 = nni_lmq_full((nni_lmq *)(puStack_30 + 2));
          if (!_Var1) {
            nni_msg_clone(m);
            nni_lmq_put((nni_lmq *)(puStack_30 + 2),m);
          }
        }
      }
    }
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
    nni_msg_free(m);
    nni_aio_finish(aio,NNG_OK,count);
  }
  else {
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  }
  return;
}

Assistant:

static void
bus0_sock_send(void *arg, nni_aio *aio)
{
	bus0_sock *s = arg;
	nni_msg   *msg;
	bus0_pipe *pipe;
	uint32_t   sender = 0;
	size_t     len;

	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg);
	nni_aio_set_msg(aio, NULL);

	// this test is so that we detect when the aio itself is terminated,
	// otherwise we could loop forever.

	if (s->raw) {
		// In raw mode, we look for the message header, to see if it
		// is being resent from another pipe (e.g. via a device).
		// We don't want to send it back to the originator.
		if (nni_msg_header_len(msg) >= sizeof(uint32_t)) {
			sender = nni_msg_header_trim_u32(msg);
		}
	} else {
		// In cooked mode just strip the header.
		nni_msg_header_clear(msg);
	}

	nni_mtx_lock(&s->mtx);

	if (!nni_aio_start(aio, NULL, NULL)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	NNI_LIST_FOREACH (&s->pipes, pipe) {

		if (s->raw && nni_pipe_id(pipe->pipe) == sender) {
			continue;
		}

		// if the pipe isn't busy, then send this message direct.
		if (!pipe->busy) {
			pipe->busy = true;
			nni_msg_clone(msg);
			nni_aio_set_msg(&pipe->aio_send, msg);
			nni_pipe_send(pipe->pipe, &pipe->aio_send);
		} else if (!nni_lmq_full(&pipe->send_queue)) {
			nni_msg_clone(msg);
			nni_lmq_put(&pipe->send_queue, msg);
		}
	}
	nni_mtx_unlock(&s->mtx);

	nni_msg_free(msg);
	nni_aio_finish(aio, 0, len);
}